

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YP_md_joint_ang_vel(YPSpur *spur,int id,double a,double v)

{
  int iVar1;
  undefined1 local_68 [8];
  YPSpur_msg msg;
  double v_local;
  double a_local;
  int id_local;
  YPSpur *spur_local;
  
  local_68 = (undefined1  [8])0x1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x803;
  msg.pid._4_4_ = id;
  msg._16_8_ = a;
  msg.data[0] = v;
  msg.data[3] = v;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)local_68);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    spur_local._4_4_ = 1;
  }
  return spur_local._4_4_;
}

Assistant:

int YP_md_joint_ang_vel(YPSpur* spur, int id, double a, double v)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_JOINT_ANG_VEL;
  msg.cs = id;
  msg.data[0] = a;
  msg.data[1] = v;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}